

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_frame.c
# Opt level: O0

void nghttp2_frame_origin_init(nghttp2_extension *frame,nghttp2_origin_entry *ov,size_t nov)

{
  size_t *psVar1;
  ulong local_38;
  size_t i;
  size_t payloadlen;
  nghttp2_ext_origin *origin;
  size_t nov_local;
  nghttp2_origin_entry *ov_local;
  nghttp2_extension *frame_local;
  
  i = 0;
  for (local_38 = 0; local_38 < nov; local_38 = local_38 + 1) {
    i = ov[local_38].origin_len + 2 + i;
  }
  nghttp2_frame_hd_init(&frame->hd,i,'\f','\0',0);
  psVar1 = (size_t *)frame->payload;
  psVar1[1] = (size_t)ov;
  *psVar1 = nov;
  return;
}

Assistant:

void nghttp2_frame_origin_init(nghttp2_extension *frame,
                               nghttp2_origin_entry *ov, size_t nov) {
  nghttp2_ext_origin *origin;
  size_t payloadlen = 0;
  size_t i;

  for (i = 0; i < nov; ++i) {
    payloadlen += 2 + ov[i].origin_len;
  }

  nghttp2_frame_hd_init(&frame->hd, payloadlen, NGHTTP2_ORIGIN,
                        NGHTTP2_FLAG_NONE, 0);

  origin = frame->payload;
  origin->ov = ov;
  origin->nov = nov;
}